

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_list_prefix_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *cclass;
  int yypos750;
  code *pcVar10;
  char *pcVar11;
  int yythunkpos758;
  
  iVar9 = G->pos;
  iVar7 = G->thunkpos;
  yyDo(G,yyPush,4,0,"yyPush");
  iVar6 = G->pos;
  iVar1 = G->thunkpos;
  iVar3 = yymatchChar(G,0x5b);
  if (iVar3 != 0) {
    iVar3 = G->pos;
    iVar8 = G->thunkpos;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar4 = yymatchChar(G,0x2a);
    if (iVar4 == 0) {
      G->pos = iVar3;
      G->thunkpos = iVar8;
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar4 = yymatchChar(G,0x2b);
      if (iVar4 == 0) {
LAB_001174db:
        G->pos = iVar3;
        G->thunkpos = iVar8;
        yyText(G,G->begin,G->end);
        G->begin = G->pos;
        iVar4 = yymatchChar(G,0x2d);
        if (iVar4 == 0) {
          G->pos = iVar3;
          G->thunkpos = iVar8;
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          iVar4 = yymatchString(G,"<=");
          if (iVar4 == 0) {
            G->pos = iVar3;
            G->thunkpos = iVar8;
            yyText(G,G->begin,G->end);
            G->begin = G->pos;
            iVar4 = yymatchString(G,">=");
            if (iVar4 == 0) {
              G->pos = iVar3;
              G->thunkpos = iVar8;
              yyText(G,G->begin,G->end);
              iVar3 = G->pos;
              iVar8 = G->thunkpos;
              G->begin = iVar3;
              iVar4 = yymatchString(G,"min");
              if (iVar4 == 0) {
                G->pos = iVar3;
                G->thunkpos = iVar8;
                iVar4 = yymatchString(G,"max");
                if (iVar4 == 0) {
                  G->pos = iVar3;
                  G->thunkpos = iVar8;
                  iVar3 = yymatchString(G,"gcd");
                  if (iVar3 == 0) goto LAB_0011775e;
                }
              }
              yyText(G,G->begin,G->end);
              iVar3 = G->pos;
              iVar8 = G->begin;
              G->end = iVar3;
              pcVar10 = yy_6_reduce_operator;
              pcVar11 = "yy_6_reduce_operator";
            }
            else {
              yyText(G,G->begin,G->end);
              iVar3 = G->pos;
              iVar8 = G->begin;
              G->end = iVar3;
              pcVar10 = yy_5_reduce_operator;
              pcVar11 = "yy_5_reduce_operator";
            }
          }
          else {
            yyText(G,G->begin,G->end);
            iVar3 = G->pos;
            iVar8 = G->begin;
            G->end = iVar3;
            pcVar10 = yy_4_reduce_operator;
            pcVar11 = "yy_4_reduce_operator";
          }
          goto LAB_00117479;
        }
        yyText(G,G->begin,G->end);
        iVar8 = G->pos;
        iVar3 = G->begin;
        G->end = iVar8;
        pcVar10 = yy_3_reduce_operator;
        pcVar11 = "yy_3_reduce_operator";
      }
      else {
        iVar4 = G->pos;
        iVar2 = G->thunkpos;
        iVar5 = yymatchClass(G,(uchar *)"",cclass);
        if (iVar5 != 0) goto LAB_001174db;
        G->pos = iVar4;
        G->thunkpos = iVar2;
        yyText(G,G->begin,G->end);
        iVar8 = G->pos;
        iVar3 = G->begin;
        G->end = iVar8;
        pcVar10 = yy_2_reduce_operator;
        pcVar11 = "yy_2_reduce_operator";
      }
      yyDo(G,pcVar10,iVar3,iVar8,pcVar11);
    }
    else {
      yyText(G,G->begin,G->end);
      iVar3 = G->pos;
      iVar8 = G->begin;
      G->end = iVar3;
      pcVar10 = yy_1_reduce_operator;
      pcVar11 = "yy_1_reduce_operator";
LAB_00117479:
      yyDo(G,pcVar10,iVar8,iVar3,pcVar11);
    }
    yyDo(G,yySet,-4,0,"yySet");
    iVar3 = yymatchChar(G,0x5d);
    if (iVar3 != 0) {
      do {
        iVar3 = G->pos;
        iVar8 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar3;
      G->thunkpos = iVar8;
      iVar3 = yy_list_infix_expr(G);
      if (iVar3 != 0) {
        yyDo(G,yySet,-3,0,"yySet");
        yyDo(G,yy_1_list_prefix_expr,G->begin,G->end,"yy_1_list_prefix_expr");
        goto LAB_001179f2;
      }
    }
  }
LAB_0011775e:
  G->pos = iVar6;
  G->thunkpos = iVar1;
  iVar6 = yy_list_infix_expr(G);
  if (iVar6 == 0) {
    G->pos = iVar9;
    G->thunkpos = iVar7;
    return 0;
  }
  yyDo(G,yySet,-2,0,"yySet");
  iVar9 = G->begin;
  iVar7 = G->end;
  pcVar10 = yy_2_list_prefix_expr;
  pcVar11 = "yy_2_list_prefix_expr";
LAB_001177b0:
  while( true ) {
    yyDo(G,pcVar10,iVar9,iVar7,pcVar11);
    iVar9 = G->pos;
    iVar7 = G->thunkpos;
    do {
      iVar6 = G->pos;
      iVar1 = G->thunkpos;
      iVar3 = yy_ws(G);
    } while (iVar3 != 0);
    G->pos = iVar6;
    G->thunkpos = iVar1;
    iVar6 = yymatchChar(G,0x3d);
    if (iVar6 == 0) break;
    iVar6 = G->pos;
    iVar1 = G->thunkpos;
    iVar3 = yymatchChar(G,0x3d);
    if (iVar3 != 0) break;
    G->pos = iVar6;
    G->thunkpos = iVar1;
    do {
      iVar6 = G->pos;
      iVar1 = G->thunkpos;
      iVar3 = yy_ws(G);
    } while (iVar3 != 0);
    G->pos = iVar6;
    G->thunkpos = iVar1;
    iVar6 = yy_list_prefix_expr(G);
    if (iVar6 == 0) break;
    yyDo(G,yySet,-1,0,"yySet");
    iVar9 = G->begin;
    iVar7 = G->end;
    pcVar10 = yy_3_list_prefix_expr;
    pcVar11 = "yy_3_list_prefix_expr";
  }
  G->pos = iVar9;
  G->thunkpos = iVar7;
  do {
    iVar6 = G->pos;
    iVar1 = G->thunkpos;
    iVar3 = yy_ws(G);
  } while (iVar3 != 0);
  G->pos = iVar6;
  G->thunkpos = iVar1;
  iVar6 = yymatchString(G,":=");
  if (iVar6 != 0) {
    iVar6 = G->pos;
    iVar1 = G->thunkpos;
    iVar3 = yymatchChar(G,0x3d);
    if (iVar3 == 0) {
      G->pos = iVar6;
      G->thunkpos = iVar1;
      do {
        iVar6 = G->pos;
        iVar1 = G->thunkpos;
        iVar3 = yy_ws(G);
      } while (iVar3 != 0);
      G->pos = iVar6;
      G->thunkpos = iVar1;
      iVar6 = yy_list_prefix_expr(G);
      if (iVar6 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar9 = G->begin;
        iVar7 = G->end;
        pcVar10 = yy_4_list_prefix_expr;
        pcVar11 = "yy_4_list_prefix_expr";
        goto LAB_001177b0;
      }
    }
  }
  G->pos = iVar9;
  G->thunkpos = iVar7;
  do {
    iVar6 = G->pos;
    iVar1 = G->thunkpos;
    iVar3 = yy_ws(G);
  } while (iVar3 != 0);
  G->pos = iVar6;
  G->thunkpos = iVar1;
  iVar6 = yymatchString(G,"::=");
  if (iVar6 != 0) {
    iVar6 = G->pos;
    iVar1 = G->thunkpos;
    iVar3 = yymatchChar(G,0x3d);
    if (iVar3 != 0) goto LAB_001179eb;
    G->pos = iVar6;
    G->thunkpos = iVar1;
    do {
      iVar6 = G->pos;
      iVar1 = G->thunkpos;
      iVar3 = yy_ws(G);
    } while (iVar3 != 0);
    G->pos = iVar6;
    G->thunkpos = iVar1;
    iVar6 = yy_list_prefix_expr(G);
    if (iVar6 == 0) goto LAB_001179eb;
    yyDo(G,yySet,-1,0,"yySet");
    iVar9 = G->begin;
    iVar7 = G->end;
    pcVar10 = yy_5_list_prefix_expr;
    pcVar11 = "yy_5_list_prefix_expr";
    goto LAB_001177b0;
  }
LAB_001179eb:
  G->pos = iVar9;
  G->thunkpos = iVar7;
LAB_001179f2:
  yyDo(G,yyPop,4,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_list_prefix_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 4, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "list_prefix_expr"));

  {  int yypos754= G->pos, yythunkpos754= G->thunkpos;  if (!yymatchChar(G, '[')) goto l755;
  if (!yy_reduce_operator(G))  goto l755;
  yyDo(G, yySet, -4, 0, "yySet");
  if (!yymatchChar(G, ']')) goto l755;
  if (!yy__(G))  goto l755;
  if (!yy_list_infix_expr(G))  goto l755;
  yyDo(G, yySet, -3, 0, "yySet");
  yyDo(G, yy_1_list_prefix_expr, G->begin, G->end, "yy_1_list_prefix_expr");
  goto l754;
  l755:;	  G->pos= yypos754; G->thunkpos= yythunkpos754;  if (!yy_list_infix_expr(G))  goto l753;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_2_list_prefix_expr, G->begin, G->end, "yy_2_list_prefix_expr");

  l756:;	
  {  int yypos757= G->pos, yythunkpos757= G->thunkpos;
  {  int yypos758= G->pos, yythunkpos758= G->thunkpos;  if (!yy__(G))  goto l759;
  if (!yymatchChar(G, '=')) goto l759;

  {  int yypos760= G->pos, yythunkpos760= G->thunkpos;  if (!yymatchChar(G, '=')) goto l760;
  goto l759;
  l760:;	  G->pos= yypos760; G->thunkpos= yythunkpos760;
  }  if (!yy__(G))  goto l759;
  if (!yy_list_prefix_expr(G))  goto l759;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_list_prefix_expr, G->begin, G->end, "yy_3_list_prefix_expr");
  goto l758;
  l759:;	  G->pos= yypos758; G->thunkpos= yythunkpos758;  if (!yy__(G))  goto l761;
  if (!yymatchString(G, ":=")) goto l761;

  {  int yypos762= G->pos, yythunkpos762= G->thunkpos;  if (!yymatchChar(G, '=')) goto l762;
  goto l761;
  l762:;	  G->pos= yypos762; G->thunkpos= yythunkpos762;
  }  if (!yy__(G))  goto l761;
  if (!yy_list_prefix_expr(G))  goto l761;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_list_prefix_expr, G->begin, G->end, "yy_4_list_prefix_expr");
  goto l758;
  l761:;	  G->pos= yypos758; G->thunkpos= yythunkpos758;  if (!yy__(G))  goto l757;
  if (!yymatchString(G, "::=")) goto l757;

  {  int yypos763= G->pos, yythunkpos763= G->thunkpos;  if (!yymatchChar(G, '=')) goto l763;
  goto l757;
  l763:;	  G->pos= yypos763; G->thunkpos= yythunkpos763;
  }  if (!yy__(G))  goto l757;
  if (!yy_list_prefix_expr(G))  goto l757;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_5_list_prefix_expr, G->begin, G->end, "yy_5_list_prefix_expr");

  }
  l758:;	  goto l756;
  l757:;	  G->pos= yypos757; G->thunkpos= yythunkpos757;
  }
  }
  l754:;	  yyprintf((stderr, "  ok   list_prefix_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 4, 0, "yyPop");
  return 1;
  l753:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "list_prefix_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}